

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

void __thiscall
TTD::ExecutionInfoManager::AddCurrentLocationDuringScan
          (ExecutionInfoManager *this,int64 topLevelEventTime)

{
  uint32 uVar1;
  SingleCallCounter *callFrame;
  undefined1 auStack_58 [8];
  TTDebuggerSourceLocation current;
  
  TTDebuggerSourceLocation::TTDebuggerSourceLocation((TTDebuggerSourceLocation *)auStack_58);
  callFrame = JsUtil::
              List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Last(&this->m_callStack);
  TTDebuggerSourceLocation::SetLocationFromFrame
            ((TTDebuggerSourceLocation *)auStack_58,topLevelEventTime,callFrame);
  if ((((((this->m_activeTTDBP).m_sourceScriptLogId != 0) &&
        ((this->m_activeTTDBP).m_topLevelBodyId == (uint32)current.m_ltime)) &&
       ((this->m_activeTTDBP).m_line == current.m_functionLine)) &&
      (((this->m_activeTTDBP).m_column == current.m_functionColumn &&
       ((this->m_activeTTDBP).m_etime == current.m_bpId)))) &&
     (((this->m_activeTTDBP).m_ftime == current.m_etime &&
      ((this->m_activeTTDBP).m_ltime == current.m_ftime)))) {
    this->m_hitContinueSearchBP = true;
  }
  if ((this->m_hitContinueSearchBP == false) &&
     (((this->m_shouldRemoveWhenDone == false ||
       (uVar1 = (this->m_activeTTDBP).m_topLevelBodyId, uVar1 != (uint32)current.m_ltime)) ||
      ((current.m_ltime._0_4_ = uVar1, (this->m_activeTTDBP).m_line != current.m_functionLine ||
       ((this->m_activeTTDBP).m_column != current.m_functionColumn)))))) {
    (this->m_continueBreakPoint).m_sourceScriptLogId = (TTD_LOG_PTR_ID)auStack_58;
    (this->m_continueBreakPoint).m_bpId = current.m_sourceScriptLogId;
    (this->m_continueBreakPoint).m_etime = current.m_bpId;
    (this->m_continueBreakPoint).m_ftime = current.m_etime;
    (this->m_continueBreakPoint).m_ltime = current.m_ftime;
    (this->m_continueBreakPoint).m_topLevelBodyId = (uint32)current.m_ltime;
    *(undefined8 *)&(this->m_continueBreakPoint).m_functionLine = current._36_8_;
    (this->m_continueBreakPoint).m_line = current.m_functionLine;
    (this->m_continueBreakPoint).m_column = current.m_functionColumn;
  }
  TTDebuggerSourceLocation::~TTDebuggerSourceLocation((TTDebuggerSourceLocation *)auStack_58);
  return;
}

Assistant:

void ExecutionInfoManager::AddCurrentLocationDuringScan(int64 topLevelEventTime)
    {
        TTDebuggerSourceLocation current;
        current.SetLocationFromFrame(topLevelEventTime, this->m_callStack.Last());

        if(this->m_activeTTDBP.HasValue() && TTDebuggerSourceLocation::AreSameLocations(this->m_activeTTDBP, current))
        {
            this->m_hitContinueSearchBP = true;
        }

        if(!this->m_hitContinueSearchBP && !this->IsLocationActiveBPAndNotExplicitBP(current))
        {
            this->m_continueBreakPoint.SetLocationCopy(current);
        }
    }